

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

int google::protobuf::internal::CalculateReserveSize(int total_size,int new_size)

{
  int iVar1;
  LogMessage *other;
  LogFinisher local_41;
  LogMessage local_40;
  
  if (new_size < 4) {
    iVar1 = 4;
  }
  else if (total_size < 0x40000000) {
    iVar1 = total_size * 2;
    if (total_size * 2 <= new_size) {
      iVar1 = new_size;
    }
  }
  else {
    if ((uint)new_size < 0x40000001) {
      LogMessage::LogMessage
                (&local_40,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x382);
      other = LogMessage::operator<<
                        (&local_40,"CHECK failed: (new_size) > (kRepeatedFieldUpperClampLimit): ");
      LogFinisher::operator=(&local_41,other);
      LogMessage::~LogMessage(&local_40);
    }
    iVar1 = 0x7fffffff;
  }
  return iVar1;
}

Assistant:

inline int CalculateReserveSize(int total_size, int new_size) {
  if (new_size < kRepeatedFieldLowerClampLimit) {
    // Clamp to smallest allowed size.
    return kRepeatedFieldLowerClampLimit;
  }
  if (total_size < kRepeatedFieldUpperClampLimit) {
    return std::max(total_size * 2, new_size);
  } else {
    // Clamp to largest allowed size.
    GOOGLE_DCHECK_GT(new_size, kRepeatedFieldUpperClampLimit);
    return std::numeric_limits<int>::max();
  }
}